

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction llvm::lostFractionThroughTruncation(integerPart *parts,uint partCount,uint bits)

{
  uint uVar1;
  int iVar2;
  uint lsb;
  uint bits_local;
  uint partCount_local;
  integerPart *parts_local;
  
  uVar1 = APInt::tcLSB(parts,partCount);
  if (uVar1 < bits) {
    if (bits == uVar1 + 1) {
      parts_local._4_4_ = lfExactlyHalf;
    }
    else {
      if ((bits <= partCount << 6) && (iVar2 = APInt::tcExtractBit(parts,bits - 1), iVar2 != 0)) {
        return lfMoreThanHalf;
      }
      parts_local._4_4_ = lfLessThanHalf;
    }
  }
  else {
    parts_local._4_4_ = lfExactlyZero;
  }
  return parts_local._4_4_;
}

Assistant:

static lostFraction
lostFractionThroughTruncation(const APFloatBase::integerPart *parts,
                              unsigned int partCount,
                              unsigned int bits)
{
  unsigned int lsb;

  lsb = APInt::tcLSB(parts, partCount);

  /* Note this is guaranteed true if bits == 0, or LSB == -1U.  */
  if (bits <= lsb)
    return lfExactlyZero;
  if (bits == lsb + 1)
    return lfExactlyHalf;
  if (bits <= partCount * APFloatBase::integerPartWidth &&
      APInt::tcExtractBit(parts, bits - 1))
    return lfMoreThanHalf;

  return lfLessThanHalf;
}